

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd.h
# Opt level: O2

void run_fdtd(fdtd *fdtd,float_type end_time,_Bool verbose)

{
  fdtd_type fVar1;
  
  fVar1 = fdtd->type;
  if (fVar1 == fdtd_three_dims) {
    run_3D_fdtd(&(fdtd->field_1).threeDims,end_time,verbose);
    return;
  }
  if (fVar1 != fdtd_two_dims) {
    if (fVar1 == fdtd_one_dim) {
      run_1D_fdtd(&(fdtd->field_1).oneDim,end_time,verbose);
      return;
    }
    return;
  }
  run_2D_fdtd(&(fdtd->field_1).twoDims,end_time,verbose);
  return;
}

Assistant:

inline void run_fdtd(struct fdtd *fdtd, float_type end_time, bool verbose) {
  switch (fdtd->type) {
  case fdtd_one_dim:
    run_1D_fdtd(&fdtd->oneDim, end_time, verbose);
    break;
  case fdtd_two_dims:
    run_2D_fdtd(&fdtd->twoDims, end_time, verbose);
    break;
  case fdtd_three_dims:
    run_3D_fdtd(&fdtd->threeDims, end_time, verbose);
    break;
  }
}